

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int doctype2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok != 0xf) {
    if (tok == 0x1b) {
      iVar1 = 6;
      pcVar2 = doctype3;
    }
    else {
      iVar1 = -1;
      pcVar2 = error;
    }
    state->handler = pcVar2;
    return iVar1;
  }
  return 3;
}

Assistant:

static int PTRCALL
doctype2(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_DOCTYPE_NONE;
  case XML_TOK_LITERAL:
    state->handler = doctype3;
    return XML_ROLE_DOCTYPE_PUBLIC_ID;
  }
  return common(state, tok);
}